

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

bool __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::ends_with
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v)

{
  int iVar1;
  bool bVar2;
  
  if (this->size_ < v.size_) {
    bVar2 = false;
  }
  else {
    iVar1 = compare(this,this->size_ - v.size_,0xffffffffffffffff,v);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

nssv_constexpr bool ends_with( basic_string_view v ) const nssv_noexcept  // (1)
    {
        return size() >= v.size() && compare( size() - v.size(), npos, v ) == 0;
    }